

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

ActionResultHolder<bool> *
testing::internal::ActionResultHolder<bool>::PerformAction<bool()>
          (Action<bool_()> *action,ArgumentTuple *args)

{
  Result value;
  ActionResultHolder<bool> *this;
  Wrapper local_19;
  ArgumentTuple *local_18;
  ArgumentTuple *args_local;
  Action<bool_()> *action_local;
  
  local_18 = args;
  args_local = (ArgumentTuple *)action;
  this = (ActionResultHolder<bool> *)operator_new(0x10);
  value = Action<bool_()>::Perform((Action<bool_()> *)args_local);
  ReferenceOrValueWrapper<bool>::ReferenceOrValueWrapper(&local_19,value);
  ActionResultHolder(this,local_19);
  return this;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }